

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapMapInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  JavascriptLibrary *pJVar1;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapType->JsTypeId == TypeIds_Map) {
    pJVar1 = Js::ScriptContext::GetLibrary(this);
    snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateMap_TTD(pJVar1);
  }
  else {
    pJVar1 = Js::ScriptContext::GetLibrary(this);
    snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateWeakMap_TTD(pJVar1);
  }
  return (RecyclableObject *)snpObject_local;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapMapInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Map)
            {
                return ctx->GetLibrary()->CreateMap_TTD();
            }
            else
            {
                return ctx->GetLibrary()->CreateWeakMap_TTD();
            }
        }